

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

string * __thiscall
despot::BaseTag::RandomMap_abi_cxx11_
          (string *__return_storage_ptr__,BaseTag *this,int height,int width,int obstacles)

{
  int iVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  long lVar3;
  int i;
  int iVar4;
  string map;
  string local_130 [32];
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  map._M_dataplus._M_p = (pointer)&map.field_2;
  std::__cxx11::string::_M_construct((ulong)&map,(char)(width + 1) * (char)height + -1);
  lVar2 = (long)width;
  for (lVar3 = 1; lVar3 < height; lVar3 = lVar3 + 1) {
    map._M_dataplus._M_p[lVar2] = '\n';
    lVar2 = lVar2 + (width + 1);
  }
  iVar4 = 0;
  while (iVar4 < obstacles) {
    iVar1 = despot::Random::NextInt(0x123168);
    if ((map._M_dataplus._M_p[iVar1] != '\n') && (map._M_dataplus._M_p[iVar1] != '#')) {
      map._M_dataplus._M_p[iVar1] = '#';
      iVar4 = iVar4 + 1;
    }
  }
  to_string<int>(&local_d0,height);
  std::operator+(&local_b0,"mapSize = ",&local_d0);
  std::operator+(&local_90,&local_b0," ");
  to_string<int>(&local_f0,width);
  std::operator+(&local_70,&local_90,&local_f0);
  std::operator+(&local_50,&local_70,"\n");
  std::__cxx11::string::string(local_130,(string *)&map);
  to_string<std::__cxx11::string>(&local_110,(despot *)local_130,t);
  std::operator+(__return_storage_ptr__,&local_50,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&map);
  return __return_storage_ptr__;
}

Assistant:

string BaseTag::RandomMap(int height, int width, int obstacles) {
	string map(height * (width + 1) - 1, '.');
	for (int h = 1; h < height; h++)
		map[h * (width + 1) - 1] = '\n';

	for (int i = 0; i < obstacles;) {
		int p = Random::RANDOM.NextInt(map.length());
		if (map[p] != '\n' && map[p] != '#') {
			map[p] = '#';
			i++;
		}
	}

	return "mapSize = " + to_string(height) + " " + to_string(width) + "\n" + to_string(map);
}